

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O3

uint64_t __thiscall
hbm::streaming::SubscribedSignal::interpreteNtpTimestamp(SubscribedSignal *this,uchar *pData)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this->m_dataTimeType != TIMETYPE_NTP) {
    return 0;
  }
  uVar1 = *(ulong *)pData;
  uVar2 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  if (this->m_dataIsBigEndian == false) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

uint64_t SubscribedSignal::interpreteNtpTimestamp(unsigned char* pData)
		{
			if(m_dataTimeType == TIMETYPE_NTP) {
				if(m_dataIsBigEndian) {
					return be64toh(*reinterpret_cast < uint64_t* > (pData));
				} else {
					return le64toh(*reinterpret_cast < uint64_t* > (pData));
				}
			} else {
				return 0;
			}
		}